

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tasks.cpp
# Opt level: O0

Task * AI::create_ChaseSight(void)

{
  Task *in_RDI;
  value_type local_ad8;
  undefined1 local_ad0 [8];
  Task stop;
  undefined1 local_750 [8];
  Task move;
  Task bark;
  value_type local_54 [3];
  allocator<char> local_39;
  string local_38;
  byte local_11;
  Task *chaseSight;
  
  local_11 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"chaseSight",&local_39);
  Task::Task(in_RDI,&local_38,Compound);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  in_RDI->identifier = ChaseSight;
  local_54[0].id = PlayerIdentified;
  local_54[0].flag = true;
  std::vector<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>::push_back
            ((vector<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_> *)in_RDI,local_54);
  bark.parameters.flags.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage._0_4_ = 0;
  bark.parameters.flags.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage._4_4_ = 4;
  std::vector<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>::push_back
            (&(in_RDI->preconditions).requiredValues,
             (value_type *)
             &bark.parameters.flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage);
  create_Bark((Task *)&move.parameters.flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_end_of_storage,RegainedSightOfPlayer);
  create_MoveToPlayer();
  std::function<void(AI::WorldState&,AI::WorldQuerier_const&,AI::Task&)>::operator=
            ((function<void(AI::WorldState&,AI::WorldQuerier_const&,AI::Task&)> *)
             &move.finally._M_invoker,
             (anon_class_1_0_00000001 *)
             ((long)&stop.parameters.flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage + 7));
  std::function<void(AI::WorldState&)>::operator=
            ((function<void(AI::WorldState&)> *)&move.finish._M_invoker,
             (anon_class_1_0_00000001 *)
             ((long)&stop.parameters.flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage + 6));
  Task::Task((Task *)local_ad0);
  std::__cxx11::string::operator=((string *)&stop.loop._M_invoker,"stop");
  stop.modifiedVectors._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 5;
  Task::addSubtask(in_RDI,(Task *)&move.parameters.flags.super__Bvector_base<std::allocator<bool>_>.
                                   _M_impl.super__Bvector_impl_data._M_end_of_storage);
  Task::addSubtask(in_RDI,(Task *)local_750);
  Task::addSubtask(in_RDI,(Task *)local_ad0);
  local_ad8.identifier = NearPlayer;
  local_ad8.index = -1;
  std::vector<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>::
  push_back(&(in_RDI->postconditions).satisfiedPredicates,&local_ad8);
  local_11 = 1;
  Task::~Task((Task *)local_ad0);
  Task::~Task((Task *)local_750);
  Task::~Task((Task *)&move.parameters.flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_end_of_storage);
  if ((local_11 & 1) == 0) {
    Task::~Task(in_RDI);
  }
  return in_RDI;
}

Assistant:

Task create_ChaseSight()
	{
		Task chaseSight {"chaseSight", TaskType::Compound};
		chaseSight.identifier = TaskIdentifier::ChaseSight;
		chaseSight.preconditions.requiredFlags.push_back({WorldStateIdentifier::PlayerIdentified, true});
		chaseSight.preconditions.requiredValues.push_back(
			{WorldStateIdentifier::Alertness, ConditionOp::GreaterThan, 60.f});

		auto bark = create_Bark(Bark::RegainedSightOfPlayer);
		auto move = create_MoveToPlayer();

		move.loop = [](WorldState& state, WorldQuerier const&, Task& task)
		{
			/*auto& target = state.current.vectors[WorldStateIdentifier::PlayerPosition];
			auto& start = state.current.vectors[WorldStateIdentifier::CurrentPosition];
			auto xAxis = target - start;
			xAxis.normalize();
			
			state.animationDriver->isHeadTracking = true;
			state.animationDriver->headRotation = 				
				(FRotationMatrix::MakeFromXZ(xAxis, {0.f, 0.f, 1.f}).ToQuat() * FQuat(FRotator(90, 0, 0)) * FQuat(FRotator(0.f, 0.f, 90.f))).Rotator();
			*/
		};

		move.finally = [](WorldState& state)
		{
			//state.animationDriver->isHeadTracking = false;
		};

		Task stop;
		stop.debugName = "stop";
		stop.action = Action::StopMoving;

		chaseSight.addSubtask(bark);
		chaseSight.addSubtask(move);
		chaseSight.addSubtask(stop);

		chaseSight.postconditions.satisfiedPredicates.push_back({SatisfiablePredicateIdentifier::NearPlayer, -1});

		return chaseSight;
	}